

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O2

void __thiscall adios2::transport::FileFStream::SeekToBegin(FileFStream *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  WaitForOpen(this);
  std::ostream::seekp((long)&this->field_0x100,_S_beg);
  std::operator+(&local_30,"couldn\'t move to the beginning of file ",
                 &(this->super_Transport).m_Name);
  std::operator+(&local_50,&local_30,", in call to fstream seekp");
  CheckFile(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void FileFStream::SeekToBegin()
{
    WaitForOpen();
    m_FileStream.seekp(0, std::ios_base::beg);
    CheckFile("couldn't move to the beginning of file " + m_Name + ", in call to fstream seekp");
}